

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::ScanInitialImplicitRoots(HeapInfo *this)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallNormalHeapBlock *this_00;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_03;
  MediumNormalHeapBlock *this_04;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this_05;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *this_06;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_07;
  long lVar3;
  
  lVar3 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar3),this->recycler);
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0xa878);
  lVar3 = 0xa878;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar3),this->recycler);
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0x10df8);
  LargeHeapBucket::ScanInitialImplicitRoots(&this->largeObjectBucket,this->recycler);
  this_00 = this->newNormalHeapBlockList;
  while (this_00 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_00,this->recycler);
    pSVar1 = (this_00->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_00 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_00 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
    }
  }
  this_01 = &this->newNormalWithBarrierHeapBlockList->
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
  while (this_01 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_01,this->recycler);
    pSVar1 = (this_01->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_01 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_01 = &HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock)->
                 super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
    }
  }
  this_02 = this->newFinalizableWithBarrierHeapBlockList;
  while (this_02 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_02,this->recycler);
    pSVar1 = (this_02->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_02 = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_02 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
  }
  this_03 = this->newFinalizableHeapBlockList;
  while (this_03 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanInitialImplicitRoots
              (&this_03->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,this->recycler)
    ;
    pSVar1 = (this_03->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_03 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_03 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
  }
  this_04 = this->newMediumNormalHeapBlockList;
  while (this_04 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_04,this->recycler);
    pSVar2 = (this_04->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_04 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_04 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
    }
  }
  this_05 = &this->newMediumNormalWithBarrierHeapBlockList->
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  while (this_05 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (this_05,this->recycler);
    pSVar2 = (this_05->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_05 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_05 = &HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                           (&pSVar2->super_HeapBlock)->
                 super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
    }
  }
  this_06 = this->newMediumFinalizableWithBarrierHeapBlockList;
  while (this_06 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_06,this->recycler);
    pSVar2 = (this_06->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_06 = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_06 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
  }
  this_07 = this->newMediumFinalizableHeapBlockList;
  while (this_07 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
              (&this_07->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,this->recycler
              );
    pSVar2 = (this_07->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_07 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_07 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
  }
  return;
}

Assistant:

void
HeapInfo::ScanInitialImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanInitialImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanInitialImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

#if ENABLE_CONCURRENT_GC
    // NOTE: Don't need to do newLeafHeapBlockList

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanInitialImplicitRoots(recycler);
    });

#endif

}